

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O3

bool ON_FileSystemPath::IsRelativePath(wchar_t *path,wchar_t directory_separator)

{
  wchar_t *pwVar1;
  
  if ((path == (wchar_t *)0x0) || (*path != L'.')) {
    return false;
  }
  pwVar1 = path + 1;
  if (path[1] == L'.') {
    pwVar1 = path + 2;
  }
  if (directory_separator == L'\0') {
    if ((*pwVar1 != L'/') && (*pwVar1 != L'\\')) {
      return false;
    }
  }
  else if (*pwVar1 != directory_separator) {
    return false;
  }
  return true;
}

Assistant:

bool ON_FileSystemPath::IsRelativePath(
  const wchar_t* path,
  const wchar_t directory_separator
  )
{
  for (;;)
  {
    if (nullptr == path)
      break;
    if ('.' != *path)
      break;
    path++;
    if ('.' == *path)
      path++;
    if (0 != directory_separator)
    {
      if (directory_separator != *path)
        break;
    }
    else
    {
      if (ON_FileSystemPath::DirectorySeparator != *path && ON_FileSystemPath::AlternateDirectorySeparator != *path)
        break;
    }

    return true;
  }
  return false;
}